

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::AmrLevel::LevelDirectoryNames(AmrLevel *this,string *dir,string *LevelDir,string *FullPath)

{
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Level_","");
  Concatenate(&local_50,&local_70,this->level,1);
  std::__cxx11::string::operator=((string *)LevelDir,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)FullPath);
  if ((FullPath->_M_string_length != 0) &&
     ((FullPath->_M_dataplus)._M_p[FullPath->_M_string_length - 1] != '/')) {
    std::__cxx11::string::push_back((char)FullPath);
  }
  std::__cxx11::string::_M_append((char *)FullPath,(ulong)(LevelDir->_M_dataplus)._M_p);
  return;
}

Assistant:

void
AmrLevel::LevelDirectoryNames (const std::string &dir,
                               std::string &LevelDir,
                               std::string &FullPath)
{
    LevelDir = amrex::Concatenate("Level_", level, 1);
    //
    // Now for the full pathname of that directory.
    //
    FullPath = dir;
    if( ! FullPath.empty() && FullPath.back() != '/') {
        FullPath += '/';
    }
    FullPath += LevelDir;
}